

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PathTypeHandler.cpp
# Opt level: O2

BOOL __thiscall
Js::PathTypeHandlerBase::PreventExtensions(PathTypeHandlerBase *this,DynamicObject *instance)

{
  int *piVar1;
  PathTypeSuccessorKey PVar2;
  DynamicType *pDVar3;
  DynamicTypeHandler *this_00;
  ScriptContext *scriptContext;
  code *pcVar4;
  bool bVar5;
  int iVar6;
  BOOL BVar7;
  undefined4 extraout_var;
  DictionaryTypeHandlerBase<unsigned_short> *pDVar8;
  undefined4 *puVar9;
  undefined4 extraout_var_00;
  SimpleDictionaryTypeHandlerBase<unsigned_short,_const_Js::PropertyRecord_*,_true> *this_01;
  RecyclerWeakReference<Js::DynamicType> *typeWeakRef;
  ArrayObject *pAVar10;
  DynamicType *newType;
  RecyclerWeakReference<Js::DynamicType> *local_50;
  RecyclerWeakReference<Js::DynamicType> *newTypeWeakRef;
  PathTypeSuccessorKey key;
  
  piVar1 = &((((((instance->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)->
             super_JavascriptLibraryBase).scriptContext.ptr)->convertPathToDictionaryExtensionsCount
  ;
  *piVar1 = *piVar1 + 1;
  iVar6 = (*(this->super_DynamicTypeHandler)._vptr_DynamicTypeHandler[0x6f])();
  if (CONCAT44(extraout_var,iVar6) != 0) {
    pDVar8 = ConvertToTypeHandler<Js::DictionaryTypeHandlerBase<unsigned_short>>(this,instance);
    iVar6 = (*(pDVar8->super_DynamicTypeHandler)._vptr_DynamicTypeHandler[0x36])(pDVar8,instance);
    return iVar6;
  }
  local_50 = (RecyclerWeakReference<Js::DynamicType> *)0x0;
  PVar2 = (PathTypeSuccessorKey)(instance->super_RecyclableObject).type.ptr;
  PathTypeSuccessorKey::PathTypeSuccessorKey
            ((PathTypeSuccessorKey *)&newTypeWeakRef,
             InternalPropertyRecords::NonExtensibleType._8_4_,ObjectSlotAttr_Default);
  bVar5 = GetSuccessor(this,(PathTypeSuccessorKey)newTypeWeakRef,&local_50);
  if ((bVar5) &&
     (pDVar3 = (DynamicType *)(local_50->super_RecyclerWeakReferenceBase).strongRef,
     pDVar3 != (DynamicType *)0x0)) {
    this_00 = (pDVar3->typeHandler).ptr;
    DynamicType::ShareType(pDVar3);
    DynamicTypeHandler::SetFlags(this_00,(this->super_DynamicTypeHandler).flags & 0x20);
    iVar6 = (*this_00->_vptr_DynamicTypeHandler[0x59])(this_00);
    if ((char)iVar6 != '\0') {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar9 = 1;
      bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                  ,0x577,"(!newTypeHandler->HasSingletonInstance())",
                                  "!newTypeHandler->HasSingletonInstance()");
      if (!bVar5) goto LAB_00c4a94f;
      *puVar9 = 0;
    }
    bVar5 = DynamicObject::IsObjectHeaderInlinedTypeHandler(instance);
    if (bVar5) {
      DynamicTypeHandler::AdjustSlots
                (instance,this_00->inlineSlotCapacity,
                 this_00->slotCapacity - (uint)this_00->inlineSlotCapacity);
    }
    DynamicTypeHandler::ReplaceInstanceType(instance,pDVar3);
    BVar7 = 1;
  }
  else {
    iVar6 = (*(this->super_DynamicTypeHandler)._vptr_DynamicTypeHandler[0x6f])(this);
    if (CONCAT44(extraout_var_00,iVar6) != 0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar9 = 1;
      bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                  ,0x55a,"(CanConvertToSimpleDictionaryType())",
                                  "CanConvertToSimpleDictionaryType()");
      if (!bVar5) goto LAB_00c4a94f;
      *puVar9 = 0;
    }
    key = PVar2;
    this_01 = ConvertToSimpleDictionaryType<Js::SimpleDictionaryTypeHandlerBase<unsigned_short,Js::PropertyRecord_const*,true>>
                        (this,instance,(uint)((this->super_DynamicTypeHandler).unusedBytes >> 1),
                         true);
    if (((this_01->super_DynamicTypeHandler).flags & 0x18) != 8) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar9 = 1;
      bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                  ,0x560,
                                  "(newTypeHandler->GetMayBecomeShared() && !newTypeHandler->GetIsShared())"
                                  ,
                                  "newTypeHandler->GetMayBecomeShared() && !newTypeHandler->GetIsShared()"
                                 );
      if (!bVar5) goto LAB_00c4a94f;
      *puVar9 = 0;
    }
    pDVar3 = (DynamicType *)(instance->super_RecyclableObject).type.ptr;
    DynamicType::LockType(pDVar3);
    if (pDVar3->isShared == true) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar9 = 1;
      bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                  ,0x563,"(!newType->GetIsShared())","!newType->GetIsShared()");
      if (!bVar5) goto LAB_00c4a94f;
      *puVar9 = 0;
    }
    scriptContext =
         (((((instance->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)->
         super_JavascriptLibraryBase).scriptContext.ptr;
    typeWeakRef = Memory::Recycler::CreateWeakReferenceHandle<Js::DynamicType>
                            (scriptContext->recycler,pDVar3);
    SetSuccessor(this,(DynamicType *)key,(PathTypeSuccessorKey)newTypeWeakRef,typeWeakRef,
                 scriptContext);
    BVar7 = SimpleDictionaryTypeHandlerBase<unsigned_short,_const_Js::PropertyRecord_*,_true>::
            PreventExtensionsInternal(this_01,instance);
    if (BVar7 == 0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar9 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar9 = 1;
      bVar5 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/PathTypeHandler.cpp"
                                  ,0x50a,"(tempResult)","tempResult");
      if (bVar5) {
        *puVar9 = 0;
        return 0;
      }
LAB_00c4a94f:
      pcVar4 = (code *)invalidInstructionException();
      (*pcVar4)();
    }
  }
  pAVar10 = DynamicObject::GetObjectArray(instance);
  if (pAVar10 != (ArrayObject *)0x0) {
    (*(pAVar10->super_DynamicObject).super_RecyclableObject.super_FinalizableObject.
      super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x35])(pAVar10);
  }
  return BVar7;
}

Assistant:

BOOL PathTypeHandlerBase::PreventExtensions(DynamicObject* instance)
    {
#ifdef PROFILE_TYPES
        instance->GetScriptContext()->convertPathToDictionaryExtensionsCount++;
#endif
        if (!CanConvertToSimpleDictionaryType())
        {
            return ConvertToDictionaryType(instance)->PreventExtensions(instance);
        }

        BOOL tempResult = this->ConvertToSharedNonExtensibleTypeIfNeededAndCallOperation(instance, InternalPropertyRecords::NonExtensibleType,
            [&](SimpleDictionaryTypeHandlerWithNonExtensibleSupport* newTypeHandler)
            {
                return newTypeHandler->PreventExtensionsInternal(instance);
            });

        Assert(tempResult);
        if (tempResult)
        {
            // Call preventExtensions on the objectArray -- which will create different type for array type handler.
            ArrayObject * objectArray = instance->GetObjectArray();
            if (objectArray)
            {
                objectArray->PreventExtensions();
            }
        }

        return tempResult;
    }